

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

uint32_t __thiscall Assimp::Ogre::VertexData::VertexSize(VertexData *this,uint16_t source)

{
  pointer pVVar1;
  size_t sVar2;
  uint32_t uVar3;
  VertexElement *element;
  pointer this_00;
  
  pVVar1 = (this->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (this_00 = (this->vertexElements).
                 super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pVVar1; this_00 = this_00 + 1
      ) {
    if (this_00->source == source) {
      sVar2 = VertexElement::Size(this_00);
      uVar3 = uVar3 + (int)sVar2;
    }
  }
  return uVar3;
}

Assistant:

uint32_t VertexData::VertexSize(uint16_t source) const
{
    uint32_t size = 0;
    for(const auto &element : vertexElements)
    {
        if (element.source == source)
            size += static_cast<uint32_t>(element.Size());
    }
    return size;
}